

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

void __thiscall
Imf_3_3::ChannelList::channelsWithPrefix
          (ChannelList *this,char *prefix,Iterator *first,Iterator *last)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  Name *in_RDI;
  size_t n;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  iterator local_158;
  Iterator local_150 [3];
  size_t local_138;
  iterator local_30;
  iterator local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Name::Name(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  local_30 = std::
             map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
             ::lower_bound((map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           (key_type *)0x2f3185);
  Iterator::Iterator((Iterator *)&local_28,&local_30);
  *local_20 = local_28._M_node;
  *local_18 = *local_20;
  sVar3 = strlen(local_10);
  local_138 = (size_t)(int)sVar3;
  while( true ) {
    ConstIterator::ConstIterator
              ((ConstIterator *)in_RDI,
               (Iterator *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    local_158 = std::
                map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
                ::end((map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    Iterator::Iterator(local_150,&local_158);
    ConstIterator::ConstIterator
              ((ConstIterator *)in_RDI,
               (Iterator *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    bVar1 = Imf_3_3::operator!=((ConstIterator *)in_RDI,
                                (ConstIterator *)
                                CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    in_stack_fffffffffffffe9f = false;
    if (bVar1) {
      __s1 = Iterator::name((Iterator *)0x2f3241);
      iVar2 = strncmp(__s1,local_10,local_138);
      in_stack_fffffffffffffe9f = iVar2 < 1;
    }
    if ((bool)in_stack_fffffffffffffe9f == false) break;
    Iterator::operator++((Iterator *)in_RDI);
  }
  return;
}

Assistant:

void
ChannelList::channelsWithPrefix (
    const char prefix[], Iterator& first, Iterator& last)
{
    first = last = _map.lower_bound (prefix);
    size_t n     = int (strlen (prefix));

    while (last != Iterator (_map.end ()) &&
           strncmp (last.name (), prefix, n) <= 0)
    {
        ++last;
    }
}